

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O0

bool __thiscall glslang::TConstUnion::operator<(TConstUnion *this,TConstUnion *constant)

{
  TConstUnion *constant_local;
  TConstUnion *this_local;
  
  if (this->type == constant->type) {
    switch(this->type) {
    case EbtDouble:
      if ((constant->field_0).dConst <= (this->field_0).dConst) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
      break;
    default:
      __assert_fail("false && \"Default missing\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                    ,0x1b1,"bool glslang::TConstUnion::operator<(const TConstUnion &) const");
    case EbtInt8:
      if ((this->field_0).i8Const < (constant->field_0).i8Const) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      break;
    case EbtUint8:
      if ((this->field_0).u8Const < (constant->field_0).u8Const) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      break;
    case EbtInt16:
      if ((this->field_0).i16Const < (constant->field_0).i16Const) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      break;
    case EbtUint16:
      if ((this->field_0).u16Const < (constant->field_0).u16Const) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      break;
    case EbtInt:
      if ((this->field_0).iConst < (constant->field_0).iConst) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      break;
    case EbtUint:
      if ((this->field_0).uConst < (constant->field_0).uConst) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      break;
    case EbtInt64:
      if ((this->field_0).i64Const < (constant->field_0).i64Const) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
      break;
    case EbtUint64:
      if ((this->field_0).u64Const < (constant->field_0).u64Const) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    return this_local._7_1_;
  }
  __assert_fail("type == constant.type",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/ConstantUnion.h"
                ,0x182,"bool glslang::TConstUnion::operator<(const TConstUnion &) const");
}

Assistant:

bool operator<(const TConstUnion& constant) const
    {
        assert(type == constant.type);
        switch (type) {
        case EbtInt8:
            if (i8Const < constant.i8Const)
                return true;

            return false;
        case EbtUint8:
            if (u8Const < constant.u8Const)
                return true;

            return false;
        case EbtInt16:
            if (i16Const < constant.i16Const)
                return true;

            return false;
        case EbtUint16:
            if (u16Const < constant.u16Const)
                return true;
            return false;
        case EbtInt64:
            if (i64Const < constant.i64Const)
                return true;

            return false;
        case EbtUint64:
            if (u64Const < constant.u64Const)
                return true;

            return false;
        case EbtDouble:
            if (dConst < constant.dConst)
                return true;

            return false;
        case EbtInt:
            if (iConst < constant.iConst)
                return true;

            return false;
        case EbtUint:
            if (uConst < constant.uConst)
                return true;

            return false;
        default:
            assert(false && "Default missing");
            return false;
        }
    }